

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

int intra_mode_info_cost_y
              (AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,BLOCK_SIZE bsize,int mode_cost,
              int discount_color_cost)

{
  uint uVar1;
  uint uVar2;
  uint plane;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  MACROBLOCKD *xd_00;
  BLOCK_SIZE in_CL;
  BLOCK_SIZE *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int n_cache;
  uint16_t color_cache [16];
  int palette_mode_cost;
  int plt_size;
  int cols;
  int rows;
  int block_height;
  int block_width;
  uint8_t *color_map;
  int mode_ctx;
  int bsize_ctx;
  MACROBLOCKD *xd;
  int try_palette;
  int use_intrabc;
  int use_filter_intra;
  int use_palette;
  ModeCosts *mode_costs;
  int total_rate;
  MB_MODE_INFO *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  COLOR_MAP_TYPE in_stack_ffffffffffffff89;
  TX_SIZE in_stack_ffffffffffffff8a;
  BLOCK_SIZE in_stack_ffffffffffffff8b;
  int in_stack_ffffffffffffff8c;
  int_mv in_stack_ffffffffffffffa0;
  int_mv in_stack_ffffffffffffffa4;
  uint16_t *color_cache_00;
  int local_28;
  
  uVar1 = (uint)(in_RDX[0x8e] != BLOCK_4X4);
  uVar2 = (uint)in_RDX[0x5b];
  plane = (uint)((byte)((ushort)*(undefined2 *)(in_RDX + 0xa7) >> 7) & 1);
  iVar3 = av1_allow_palette((uint)(*(byte *)(in_RDI + 0x3c16f) & 1),*in_RDX);
  local_28 = in_R8D;
  if ((iVar3 != 0) && (in_RDX[2] == BLOCK_4X4)) {
    xd_00 = (MACROBLOCKD *)(in_RSI + 0x1a0);
    iVar3 = av1_get_palette_bsize_ctx(in_CL);
    iVar4 = av1_get_palette_mode_ctx(xd_00);
    local_28 = *(int *)(in_RSI + 0x7e18 + (long)iVar3 * 0x18 + (long)iVar4 * 8 +
                       (long)(int)uVar1 * 4) + in_R8D;
    if (uVar1 != 0) {
      color_cache_00 = (uint16_t *)xd_00->plane[0].color_index_map;
      in_stack_ffffffffffffff58 = (MB_MODE_INFO *)&stack0xffffffffffffff98;
      av1_get_block_dimensions
                (in_CL,0,xd_00,(int *)&stack0xffffffffffffffa4,(int *)&stack0xffffffffffffffa0,
                 (int *)&stack0xffffffffffffff9c,(int *)in_stack_ffffffffffffff58);
      uVar5 = (uint)in_RDX[0x8e];
      in_stack_ffffffffffffff60 =
           *(int *)(in_RSI + 0x73d0 + (long)iVar3 * 0x1c + (long)(int)(uVar5 - 2) * 4);
      iVar6 = write_uniform_cost(in_stack_ffffffffffffff60,
                                 (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      iVar6 = in_stack_ffffffffffffff60 + iVar6;
      in_stack_ffffffffffffff64 =
           av1_get_palette_cache((MACROBLOCKD *)CONCAT44(uVar1,uVar2),plane,(uint16_t *)xd_00);
      iVar3 = av1_palette_color_cost_y
                        ((PALETTE_MODE_INFO *)CONCAT44(iVar3,iVar4),color_cache_00,
                         in_stack_ffffffffffffffa4.as_int,in_stack_ffffffffffffffa0.as_int);
      iVar3 = iVar3 + iVar6;
      if (in_R9D == 0) {
        iVar4 = av1_cost_color_map((MACROBLOCK *)CONCAT44(uVar5,iVar3),in_stack_ffffffffffffff8c,
                                   in_stack_ffffffffffffff8b,in_stack_ffffffffffffff8a,
                                   in_stack_ffffffffffffff89);
        iVar3 = iVar4 + iVar3;
      }
      local_28 = iVar3 + local_28;
    }
  }
  iVar3 = av1_filter_intra_allowed
                    ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
  if ((iVar3 != 0) &&
     (local_28 = *(int *)(in_RSI + 0x6e24 + (ulong)*in_RDX * 8 + (long)(int)uVar2 * 4) + local_28,
     uVar2 != 0)) {
    local_28 = *(int *)(in_RSI + 0x6ed4 + (ulong)in_RDX[0x5a] * 4) + local_28;
  }
  iVar3 = av1_is_directional_mode(in_RDX[2]);
  if ((iVar3 != 0) && (iVar3 = av1_use_angle_delta(in_CL), iVar3 != 0)) {
    local_28 = *(int *)(in_RSI + 0x6ee8 + (long)(int)(in_RDX[2] - 1) * 0x1c +
                       (long)((char)in_RDX[0x58] + 3) * 4) + local_28;
  }
  iVar3 = av1_allow_intrabc((AV1_COMMON *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (iVar3 != 0) {
    local_28 = *(int *)(in_RSI + 0x73c8 + (long)(int)plane * 4) + local_28;
  }
  return local_28;
}

Assistant:

static inline int intra_mode_info_cost_y(const AV1_COMP *cpi,
                                         const MACROBLOCK *x,
                                         const MB_MODE_INFO *mbmi,
                                         BLOCK_SIZE bsize, int mode_cost,
                                         int discount_color_cost) {
  int total_rate = mode_cost;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int use_palette = mbmi->palette_mode_info.palette_size[0] > 0;
  const int use_filter_intra = mbmi->filter_intra_mode_info.use_filter_intra;
  const int use_intrabc = mbmi->use_intrabc;
  // Can only activate one mode.
  assert(((mbmi->mode != DC_PRED) + use_palette + use_intrabc +
          use_filter_intra) <= 1);
  const int try_palette = av1_allow_palette(
      cpi->common.features.allow_screen_content_tools, mbmi->bsize);
  if (try_palette && mbmi->mode == DC_PRED) {
    const MACROBLOCKD *xd = &x->e_mbd;
    const int bsize_ctx = av1_get_palette_bsize_ctx(bsize);
    const int mode_ctx = av1_get_palette_mode_ctx(xd);
    total_rate +=
        mode_costs->palette_y_mode_cost[bsize_ctx][mode_ctx][use_palette];
    if (use_palette) {
      const uint8_t *const color_map = xd->plane[0].color_index_map;
      int block_width, block_height, rows, cols;
      av1_get_block_dimensions(bsize, 0, xd, &block_width, &block_height, &rows,
                               &cols);
      const int plt_size = mbmi->palette_mode_info.palette_size[0];
      int palette_mode_cost =
          mode_costs
              ->palette_y_size_cost[bsize_ctx][plt_size - PALETTE_MIN_SIZE] +
          write_uniform_cost(plt_size, color_map[0]);
      uint16_t color_cache[2 * PALETTE_MAX_SIZE];
      const int n_cache = av1_get_palette_cache(xd, 0, color_cache);
      palette_mode_cost +=
          av1_palette_color_cost_y(&mbmi->palette_mode_info, color_cache,
                                   n_cache, cpi->common.seq_params->bit_depth);
      if (!discount_color_cost)
        palette_mode_cost +=
            av1_cost_color_map(x, 0, bsize, mbmi->tx_size, PALETTE_MAP);

      total_rate += palette_mode_cost;
    }
  }
  if (av1_filter_intra_allowed(&cpi->common, mbmi)) {
    total_rate += mode_costs->filter_intra_cost[mbmi->bsize][use_filter_intra];
    if (use_filter_intra) {
      total_rate +=
          mode_costs->filter_intra_mode_cost[mbmi->filter_intra_mode_info
                                                 .filter_intra_mode];
    }
  }
  if (av1_is_directional_mode(mbmi->mode)) {
    if (av1_use_angle_delta(bsize)) {
      total_rate +=
          mode_costs->angle_delta_cost[mbmi->mode - V_PRED]
                                      [MAX_ANGLE_DELTA +
                                       mbmi->angle_delta[PLANE_TYPE_Y]];
    }
  }
  if (av1_allow_intrabc(&cpi->common))
    total_rate += mode_costs->intrabc_cost[use_intrabc];
  return total_rate;
}